

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void m68k_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *pTVar2;
  CPUArchState_conflict3 *env;
  long lVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uintptr_t o_3;
  undefined1 *puVar8;
  long *plVar9;
  TCGv_i32 pTVar10;
  TCGv_i64 pTVar11;
  TCGv_i64 pTVar12;
  uintptr_t o_6;
  uintptr_t o_5;
  uintptr_t o;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGTemp *ts_00;
  uintptr_t o_2;
  TCGTemp *ts_01;
  long lVar13;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  lVar13 = *(long *)&dcbase[6].is_jmp;
  pTVar2 = *(TCGContext_conflict2 **)(lVar13 + 0x2e8);
  env = (CPUArchState_conflict3 *)cpu->env_ptr;
  local_58 = (TCGTemp *)(ulong)dcbase[1].pc_first;
  if (*(int *)(lVar13 + 0x57c) == 0) {
    if (*(TCGTemp **)(lVar13 + 0x578 + (long)*(int *)(lVar13 + 0x39e0) * 8) == local_58)
    goto LAB_00704d4a;
  }
  else {
    puVar8 = (undefined1 *)g_tree_lookup(*(GTree **)(lVar13 + 0x780),&local_58);
    if (puVar8 == &DAT_00000001) {
LAB_00704d4a:
      gen_exception((DisasContext_conflict2 *)dcbase,dcbase[1].pc_first,0x10001);
      return;
    }
  }
  plVar9 = *(long **)(lVar13 + 0x358);
  uVar7 = dcbase[1].pc_first;
  if (plVar9 != (long *)0x0) {
    do {
      lVar3 = plVar9[1];
      if ((*(ulong *)(lVar3 + 0x20) < *(ulong *)(lVar3 + 0x18) ||
           (ulong)uVar7 <= *(ulong *)(lVar3 + 0x20) && *(ulong *)(lVar3 + 0x18) <= (ulong)uVar7) &&
         (*(char *)(lVar3 + 0x14) != '\x01')) {
        tcg_gen_op2_m68k(pTVar2,INDEX_op_movi_i32,(TCGArg)(QREG_PC + (long)pTVar2),(long)(int)uVar7)
        ;
        uVar7 = dcbase[1].pc_first;
        pTVar10 = tcg_const_i32_m68k(pTVar2,2);
        pTVar11 = tcg_const_i64_m68k(pTVar2,lVar13);
        pTVar12 = tcg_const_i64_m68k(pTVar2,(ulong)uVar7);
        ts = (TCGTemp *)(pTVar11 + (long)pTVar2);
        ts_00 = (TCGTemp *)(pTVar12 + (long)pTVar2);
        ts_01 = (TCGTemp *)(pTVar10 + (long)pTVar2);
        local_60 = (TCGTemp *)0x0;
        local_78 = ts;
        local_70 = ts_00;
        local_68 = ts_01;
        if (*(int *)(lVar13 + 0x4f8) == 1) {
          for (puVar4 = *(undefined8 **)(lVar13 + 0x358); puVar4 != (undefined8 *)0x0;
              puVar4 = (undefined8 *)*puVar4) {
            lVar3 = puVar4[1];
            if (*(char *)(lVar3 + 0x14) == '\0') {
              pTVar11 = tcg_const_i64_m68k(pTVar2,*(int64_t *)(lVar3 + 0x30));
              local_60 = (TCGTemp *)(pTVar11 + (long)pTVar2);
              (**(code **)(lVar13 + 0x178))(lVar13,lVar3,&local_78,4);
              tcg_temp_free_internal_m68k(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
            }
          }
        }
        else {
          pTVar10 = tcg_const_i32_m68k(pTVar2,2);
          local_58 = ts_01;
          local_50 = (TCGTemp *)(pTVar10 + (long)pTVar2);
          local_48 = ts;
          local_40 = ts_00;
          tcg_gen_callN_m68k(pTVar2,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
          tcg_temp_free_internal_m68k(pTVar2,(TCGTemp *)(pTVar10 + (long)pTVar2));
        }
        tcg_temp_free_internal_m68k(pTVar2,ts_00);
        tcg_temp_free_internal_m68k(pTVar2,ts);
        tcg_temp_free_internal_m68k(pTVar2,ts_01);
        check_exit_request_m68k(pTVar2);
        uVar7 = dcbase[1].pc_first;
        break;
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  uVar6 = cpu_lduw_code_m68k(env,uVar7);
  dcbase[1].pc_first = dcbase[1].pc_first + 2;
  (*opcode_table[uVar6 & 0xffff])(env,(DisasContext_conflict2 *)dcbase,(uint16_t)uVar6);
  uVar7 = *(uint *)((long)&dcbase[2].tb + 4);
  if (uVar7 != 0) {
    pTVar2 = *(TCGContext_conflict2 **)(*(long *)&dcbase[6].is_jmp + 0x2e8);
    *(undefined4 *)((long)&dcbase[2].tb + 4) = 0;
    do {
      uVar5 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      lVar13 = *(long *)((long)pTVar2->cpu_aregs + (ulong)(uVar5 * 8));
      lVar3 = *(long *)((long)&dcbase[2].pc_first + (ulong)(uVar5 * 8));
      if (lVar13 != lVar3) {
        tcg_gen_op2_m68k(pTVar2,INDEX_op_mov_i32,(long)&pTVar2->pool_cur + lVar13,
                         (long)&pTVar2->pool_cur + lVar3);
        lVar13 = *(long *)(&dcbase[2].pc_first + (ulong)uVar5 * 2);
      }
      tcg_temp_free_internal_m68k(pTVar2,(TCGTemp *)((long)&pTVar2->pool_cur + lVar13));
      uVar7 = uVar7 - 1 & uVar7;
    } while (uVar7 != 0);
  }
  if (0 < (int)dcbase[4].pc_first) {
    pTVar2 = *(TCGContext_conflict2 **)(*(long *)&dcbase[6].is_jmp + 0x2e8);
    lVar13 = 0;
    do {
      tcg_temp_free_internal_m68k
                (pTVar2,(TCGTemp *)
                        ((long)&pTVar2->pool_cur + *(long *)(&dcbase[4].is_jmp + lVar13 * 2)));
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)dcbase[4].pc_first);
  }
  dcbase[4].pc_first = 0;
  tVar1 = dcbase[1].pc_first;
  dcbase->pc_next = tVar1;
  if ((dcbase->is_jmp == DISAS_NEXT) && (0xfdf < tVar1 - (dcbase->pc_first & 0xfffff000))) {
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return;
}

Assistant:

static void m68k_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUM68KState *env = cpu->env_ptr;
    uint16_t insn;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dc->pc)) {
        gen_exception(dc, dc->pc, EXCP_HLT);
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->pc)) {

        // Sync PC in advance
        tcg_gen_movi_i32(tcg_ctx, QREG_PC, dc->pc);

        gen_uc_tracecode(tcg_ctx, 2, UC_HOOK_CODE_IDX, uc, dc->pc);
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    insn = read_im16(env, dc);

    opcode_table[insn](env, dc, insn);
    do_writebacks(dc);
    do_release(dc);

    dc->base.pc_next = dc->pc;

    if (dc->base.is_jmp == DISAS_NEXT) {
        /*
         * Stop translation when the next insn might touch a new page.
         * This ensures that prefetch aborts at the right place.
         *
         * We cannot determine the size of the next insn without
         * completely decoding it.  However, the maximum insn size
         * is 32 bytes, so end if we do not have that much remaining.
         * This may produce several small TBs at the end of each page,
         * but they will all be linked with goto_tb.
         *
         * ??? ColdFire maximum is 4 bytes; MC68000's maximum is also
         * smaller than MC68020's.
         */
        target_ulong start_page_offset
            = dc->pc - (dc->base.pc_first & TARGET_PAGE_MASK);

        if (start_page_offset >= TARGET_PAGE_SIZE - 32) {
            dc->base.is_jmp = DISAS_TOO_MANY;
        }
    }
}